

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes Flush(CLzmaEnc *p,UInt32 nowPos)

{
  CRangeEnc *p_00;
  int iVar1;
  uint uVar2;
  UInt32 m;
  ulong uVar3;
  UInt32 m_1;
  uint uVar4;
  bool bVar5;
  
  p->finished = 1;
  if (p->writeEndMark != 0) {
    uVar4 = nowPos & p->pbMask;
    p_00 = &p->rc;
    uVar3 = 1;
    RangeEnc_EncodeBit(p_00,p->isMatch[p->state] + uVar4,1);
    RangeEnc_EncodeBit(p_00,p->isRep + p->state,0);
    p->state = kMatchNextStates[p->state];
    LenEnc_Encode2(&p->lenEnc,p_00,0,uVar4,(uint)(p->fastMode == 0),p->ProbPrices);
    uVar4 = 5;
    do {
      bVar5 = (0x3fU >> (uVar4 & 0x1f) & 1) != 0;
      RangeEnc_EncodeBit(p_00,p->posSlotEncoder[0] + uVar3,(uint)bVar5);
      uVar3 = (ulong)((uint)bVar5 + (int)uVar3 * 2);
      bVar5 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar5);
    RangeEnc_EncodeDirectBits(p_00,0x3ffffff,0x1a);
    uVar4 = 1;
    uVar2 = 0xf;
    iVar1 = 4;
    do {
      RangeEnc_EncodeBit(p_00,p->posAlignEncoder + uVar4,uVar2 & 1);
      uVar4 = (uVar2 & 1) + uVar4 * 2;
      uVar2 = uVar2 >> 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  iVar1 = 5;
  do {
    RangeEnc_ShiftLow(&p->rc);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  RangeEnc_FlushStream(&p->rc);
  iVar1 = p->result;
  if (iVar1 == 0) {
    if ((p->rc).res != 0) {
      p->result = 9;
    }
    if ((p->matchFinderBase).result != 0) {
      p->result = 8;
    }
    iVar1 = p->result;
    if (iVar1 != 0) {
      p->finished = 1;
    }
  }
  return iVar1;
}

Assistant:

static SRes Flush(CLzmaEnc *p, UInt32 nowPos)
{
  /* ReleaseMFStream(); */
  p->finished = True;
  if (p->writeEndMark)
    WriteEndMarker(p, nowPos & p->pbMask);
  RangeEnc_FlushData(&p->rc);
  RangeEnc_FlushStream(&p->rc);
  return CheckErrors(p);
}